

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void instantiate(ecs_world_t *world,ecs_entity_t base,ecs_table_t *table,ecs_data_t *data,
                int32_t row,int32_t count)

{
  uint uVar1;
  ecs_vector_t *vector;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,base);
  if (vector != (ecs_vector_t *)0x0) {
    uVar1 = ecs_vector_count(vector);
    pvVar2 = _ecs_vector_first(vector,8,0x10);
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      instantiate_children
                (world,base,table,data,row,count,*(ecs_table_t **)((long)pvVar2 + uVar4 * 8));
    }
  }
  return;
}

Assistant:

static
void instantiate(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count)
{    
    /* If base is a parent, instantiate children of base for instances */

    ecs_vector_t *child_tables = ecs_map_get_ptr(
        world->child_tables, ecs_vector_t*, base);

    if (child_tables) {
        ecs_vector_each(child_tables, ecs_table_t*, child_table_ptr, {
            instantiate_children(
                world, base, table, data, row, count, *child_table_ptr);
        });
    }
}